

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::BuildInlineImportMap(WatWriter *this)

{
  bool bVar1;
  ExternalKind EVar2;
  vector<wabt::Import_*,_std::allocator<wabt::Import_*>_> *this_00;
  reference ppIVar3;
  Import *local_30;
  Import *import;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Import_*,_std::allocator<wabt::Import_*>_> *__range2;
  WatWriter *this_local;
  
  if ((this->options_->inline_import & 1U) != 0) {
    if (this->module_ == (Module *)0x0) {
      __assert_fail("module_",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wat-writer.cc"
                    ,0x6be,"void wabt::(anonymous namespace)::WatWriter::BuildInlineImportMap()");
    }
    this_00 = &this->module_->imports;
    __end2 = std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>::begin(this_00);
    import = (Import *)std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wabt::Import_*const_*,_std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>_>
                                       *)&import), bVar1) {
      ppIVar3 = __gnu_cxx::
                __normal_iterator<wabt::Import_*const_*,_std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>_>
                ::operator*(&__end2);
      local_30 = *ppIVar3;
      EVar2 = Import::kind(local_30);
      std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>::push_back
                (this->inline_import_map_ + (int)EVar2,&local_30);
      __gnu_cxx::
      __normal_iterator<wabt::Import_*const_*,_std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void WatWriter::BuildInlineImportMap() {
  if (!options_.inline_import) {
    return;
  }

  assert(module_);
  for (const Import* import : module_->imports) {
    inline_import_map_[static_cast<size_t>(import->kind())].push_back(import);
  }
}